

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

BasicBrokerInfo * __thiscall
helics::CoreBroker::getBrokerById(CoreBroker *this,GlobalBrokerId brokerid)

{
  pointer pBVar1;
  iterator iVar2;
  BasicBrokerInfo *pBVar3;
  GlobalBrokerId GVar4;
  BasicBrokerInfo *pBVar5;
  BasicBrokerInfo *pBVar6;
  key_type local_c;
  
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    GVar4.gid = brokerid.gid + 0x90000000;
    if (brokerid.gid < 0x70000000) {
      GVar4.gid = brokerid.gid;
    }
    if ((GVar4.gid < 0) ||
       (pBVar1 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->mBrokers).dataStorage.
                           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3) *
       -0x45d1745d <= GVar4.gid)) {
      pBVar3 = (BasicBrokerInfo *)0x0;
    }
    else {
      pBVar3 = pBVar1 + (uint)GVar4.gid;
    }
  }
  else {
    local_c.gid = brokerid.gid;
    iVar2 = CLI::std::
            _Hashtable<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->mBrokers).lookup2._M_h,&local_c);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) {
      pBVar5 = (this->mBrokers).dataStorage.
               super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar6 = pBVar5;
    }
    else {
      pBVar5 = (this->mBrokers).dataStorage.
               super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false>
                               ._M_cur + 0x10);
      pBVar6 = (this->mBrokers).dataStorage.
               super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    pBVar3 = (BasicBrokerInfo *)0x0;
    if (pBVar5 != pBVar6) {
      pBVar3 = pBVar5;
    }
  }
  return pBVar3;
}

Assistant:

BasicBrokerInfo* CoreBroker::getBrokerById(GlobalBrokerId brokerid)
{
    if (isRootc) {
        auto brkNum = brokerid.localIndex();
        return (isValidIndex(brkNum, mBrokers) ? &mBrokers[brkNum] : nullptr);
    }

    auto fnd = mBrokers.find(brokerid);
    return (fnd != mBrokers.end()) ? &(*fnd) : nullptr;
}